

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O1

void ffdhe_compute_exp(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n,uint64_t *sk_n,uint64_t *b_n,
                      uint8_t *res)

{
  byte *pbVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  ulong *puVar9;
  long lVar10;
  uint8_t *pk;
  uint8_t *extraout_RDX;
  long *extraout_RDX_00;
  uint8_t *pk_00;
  void *extraout_RDX_01;
  size_t sVar11;
  void *__s;
  byte bVar12;
  undefined7 in_register_00000039;
  void *__s_00;
  uint64_t *puVar13;
  uint64_t *puVar14;
  uint uVar15;
  uint64_t *res_00;
  ulong *__s_01;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  undefined8 uStack_198;
  void *pvStack_190;
  code *pcStack_160;
  uint64_t uStack_158;
  code *pcStack_128;
  void *pvStack_120;
  size_t sStack_118;
  uint64_t *puStack_110;
  ulong uStack_108;
  void *pvStack_100;
  code *pcStack_d0;
  uint64_t *apuStack_c8 [2];
  uint8_t *puStack_b8;
  ulong uStack_b0;
  uint8_t *puStack_a8;
  code *pcStack_78;
  code *pcStack_50;
  uint8_t *local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  
  uVar16 = CONCAT71(in_register_00000039,a);
  local_48 = res;
  local_40 = sk_n;
  local_38 = b_n;
  if (a < 5) {
    uVar15 = *(uint *)(&DAT_001e4c48 + (ulong)a * 4);
    uVar16 = (ulong)uVar15;
    lVar3 = -(uVar16 * 8 + 0xf & 0xfffffffffffffff0);
    puVar14 = (uint64_t *)((long)&local_48 + lVar3);
    *(undefined8 *)((long)&pcStack_50 + lVar3) = 0x1638ec;
    memset(puVar14,0,uVar16 << 3);
    uVar8 = *p_r2_n;
    *(undefined8 *)((long)&pcStack_50 + lVar3) = 0x1638f5;
    uVar8 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar8);
    puVar13 = local_38;
    *(uint64_t **)((long)&pcStack_50 + lVar3) = puVar14;
    *(uint64_t **)(&stack0xffffffffffffffa8 + lVar3) = local_40;
    *(undefined8 *)(&stack0xffffffffffffffa0 + lVar3) = 0x163915;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (uVar15,p_r2_n,uVar8,p_r2_n + uVar16,puVar13,uVar15 << 6,
               *(uint64_t **)(&stack0xffffffffffffffa8 + lVar3),
               *(uint64_t **)((long)&pcStack_50 + lVar3));
    puVar7 = local_48;
    uVar2 = *(uint32_t *)(&DAT_001e4c5c + (ulong)a * 4);
    *(undefined8 *)((long)&pcStack_50 + lVar3) = 0x163930;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uVar2,puVar14,puVar7);
    return;
  }
  pcStack_50 = Hacl_FFDHE_ffdhe_secret_to_public;
  ffdhe_compute_exp_cold_1();
  bVar12 = (byte)uVar16;
  if (bVar12 < 5) {
    lVar3 = *(long *)(&DAT_001e4c88 + (uVar16 & 0xff) * 8);
    lVar10 = -(lVar3 * 8 + 0xfU & 0xfffffffffffffff0);
    puVar13 = (uint64_t *)(&stack0xffffffffffffff90 + lVar10);
    pcStack_50 = (code *)&stack0xfffffffffffffff8;
    *(undefined8 *)((long)&pcStack_78 + lVar10) = 0x16398d;
    memset(puVar13,0,lVar3 << 3);
    *(undefined8 *)((long)&pcStack_78 + lVar10) = 0x163998;
    ffdhe_precomp_p(bVar12,puVar13);
    *(undefined8 *)((long)&pcStack_78 + lVar10) = 0x1639a9;
    Hacl_FFDHE_ffdhe_secret_to_public_precomp(bVar12,puVar13,(uint8_t *)p_r2_n,pk);
    return;
  }
  pcStack_78 = Hacl_FFDHE_ffdhe_shared_secret_precomp;
  pcStack_50 = (code *)&stack0xfffffffffffffff8;
  Hacl_FFDHE_ffdhe_secret_to_public_cold_1();
  apuStack_c8[0] = p_r2_n;
  apuStack_c8[1] = b_n;
  puStack_a8 = res;
  if ((byte)uVar16 < 5) {
    uStack_b0 = uVar16 & 0xff;
    uVar2 = *(uint32_t *)(&DAT_001e4c5c + uStack_b0 * 4);
    uVar16 = (ulong)(uVar2 - 1 & 0xfffffff8);
    uVar17 = uVar16 + 0x17 & 0xfffffffffffffff0;
    lVar3 = -uVar17;
    res_00 = (uint64_t *)((long)apuStack_c8 + lVar3);
    sVar11 = uVar16 + 8;
    puStack_b8 = extraout_RDX;
    pcStack_78 = (code *)&pcStack_50;
    *(undefined8 *)((long)&pcStack_d0 + lVar3) = 0x163a22;
    memset(res_00,0,sVar11);
    uVar16 = uStack_b0;
    puVar14 = (uint64_t *)((long)res_00 - uVar17);
    puVar14[-1] = 0x163a3c;
    memset(puVar14,0,sVar11);
    puVar14[-1] = 0x163a4b;
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar2,puStack_b8,res_00);
    puVar13 = apuStack_c8[1];
    puVar14[-1] = 0x163a5a;
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar2,(uint8_t *)puVar13,puVar14);
    puVar13 = apuStack_c8[0];
    puVar14[-1] = 0x163a6c;
    uVar8 = ffdhe_check_pk((Spec_FFDHE_ffdhe_alg)uVar16,puVar14,puVar13);
    puVar7 = puStack_a8;
    if (uVar8 == 0xffffffffffffffff) {
      puVar14[-1] = 0x163a8a;
      ffdhe_compute_exp((Spec_FFDHE_ffdhe_alg)uVar16,puVar13,res_00,puVar14,puVar7);
    }
    return;
  }
  pcStack_d0 = ffdhe_check_pk;
  pcStack_78 = (code *)&pcStack_50;
  Hacl_FFDHE_ffdhe_shared_secret_precomp_cold_1();
  puStack_110 = p_r2_n;
  if ((byte)uVar16 < 5) {
    uVar15 = *(uint *)(&DAT_001e4c70 + (uVar16 & 0xff) * 4);
    uStack_108 = (ulong)(uVar15 >> 3);
    uVar16 = (ulong)(uVar15 & 0xfffffff8) + 0x17 & 0xfffffffffffffff0;
    lVar3 = -uVar16;
    __s = (void *)((long)&pvStack_120 + lVar3);
    sVar11 = uStack_108 * 8 + 8;
    pvStack_100 = (void *)(uStack_108 + 1);
    sStack_118 = sVar11;
    pcStack_d0 = (code *)&pcStack_78;
    *(undefined8 *)((long)&pcStack_128 + lVar3) = 0x163b17;
    memset(__s,0,sVar11);
    bVar18 = *extraout_RDX_00 == 0;
    *(long *)((long)&pvStack_120 - uVar16) = *extraout_RDX_00 + -1;
    uVar15 = uVar15 >> 5;
    uVar16 = (ulong)uVar15;
    lVar10 = 0x20;
    do {
      uVar17 = *(ulong *)((long)extraout_RDX_00 + lVar10 + -0x18);
      *(ulong *)(&stack0xfffffffffffffec8 + lVar10 + lVar3) = uVar17 - bVar18;
      uVar4 = *(ulong *)((long)extraout_RDX_00 + lVar10 + -0x10);
      uVar6 = (ulong)(uVar17 < bVar18);
      *(ulong *)(&stack0xfffffffffffffed0 + lVar10 + lVar3) = uVar4 - uVar6;
      uVar17 = *(ulong *)((long)extraout_RDX_00 + lVar10 + -8);
      uVar4 = (ulong)(uVar4 < uVar6);
      *(ulong *)((long)&pcStack_128 + lVar10 + lVar3) = uVar17 - uVar4;
      uVar17 = (ulong)(uVar17 < uVar4);
      bVar18 = *(ulong *)((long)extraout_RDX_00 + lVar10) < uVar17;
      *(ulong *)((long)__s + lVar10) = *(ulong *)((long)extraout_RDX_00 + lVar10) - uVar17;
      lVar10 = lVar10 + 0x20;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
    if (uVar15 * 4 < (uint)uStack_108) {
      uVar16 = (ulong)(uVar15 * 4);
      uVar17 = uStack_108 & 0xffffffff;
      do {
        uVar4 = (ulong)bVar18;
        bVar18 = (ulong)extraout_RDX_00[uVar16 + 1] < uVar4;
        *(ulong *)((long)&sStack_118 + uVar16 * 8 + lVar3) = extraout_RDX_00[uVar16 + 1] - uVar4;
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    sVar11 = sStack_118;
    uVar16 = (long)pvStack_100 * 8 + 0xfU & 0xfffffffffffffff0;
    __s_00 = (void *)((long)__s - uVar16);
    uVar17 = 0;
    pvStack_120 = __s;
    pvStack_100 = __s_00;
    *(undefined8 *)((long)__s_00 + -8) = 0x163be3;
    memset(__s_00,0,sVar11);
    pbVar1 = (byte *)((long)__s - uVar16);
    *pbVar1 = *pbVar1 | 1;
    uStack_108 = (ulong)((int)uStack_108 + 1);
    do {
      uVar8 = *(uint64_t *)((long)pvStack_100 + uVar17 * 8);
      uVar5 = puStack_110[uVar17];
      *(undefined8 *)((long)__s_00 + -8) = 0x163c10;
      FStar_UInt64_eq_mask(uVar8,uVar5);
      *(undefined8 *)((long)__s_00 + -8) = 0x163c1e;
      FStar_UInt64_gte_mask(uVar8,uVar5);
      uVar17 = uVar17 + 1;
    } while (uStack_108 != uVar17);
    uVar16 = 0;
    do {
      uVar8 = puStack_110[uVar16];
      uVar5 = *(uint64_t *)((long)pvStack_120 + uVar16 * 8);
      *(undefined8 *)((long)__s_00 + -8) = 0x163c5d;
      pvStack_100 = (void *)FStar_UInt64_eq_mask(uVar8,uVar5);
      *(undefined8 *)((long)__s_00 + -8) = 0x163c6c;
      FStar_UInt64_gte_mask(uVar8,uVar5);
      uVar16 = uVar16 + 1;
    } while (uStack_108 != uVar16);
    return;
  }
  pcStack_128 = Hacl_FFDHE_ffdhe_shared_secret;
  pcStack_d0 = (code *)&pcStack_78;
  ffdhe_check_pk_cold_1();
  uVar15 = (uint)uVar16;
  bVar12 = (byte)uVar16;
  if (bVar12 < 5) {
    lVar3 = *(long *)(&DAT_001e4c88 + (uVar16 & 0xff) * 8);
    lVar10 = -(lVar3 * 8 + 0xfU & 0xfffffffffffffff0);
    puVar13 = (uint64_t *)((long)&uStack_158 + lVar10);
    pcStack_128 = (code *)&pcStack_d0;
    *(undefined8 *)((long)&pcStack_160 + lVar10) = 0x163cf8;
    memset(puVar13,0,lVar3 << 3);
    *(undefined8 *)((long)&pcStack_160 + lVar10) = 0x163d03;
    ffdhe_precomp_p(bVar12,puVar13);
    *(undefined8 *)((long)&pcStack_160 + lVar10) = 0x163d17;
    Hacl_FFDHE_ffdhe_shared_secret_precomp(bVar12,puVar13,(uint8_t *)p_r2_n,pk_00,(uint8_t *)b_n);
    return;
  }
  pcStack_160 = Hacl_Bignum_Convert_bn_to_bytes_be_uint64;
  pcStack_128 = (code *)&pcStack_d0;
  Hacl_FFDHE_ffdhe_shared_secret_cold_1();
  uVar16 = (ulong)((uVar15 - 1 & 0xfffffff8) + 8);
  lVar3 = -(uVar16 + 0xf & 0xfffffffffffffff0);
  __s_01 = (ulong *)((long)&pvStack_190 + lVar3);
  pvStack_190 = extraout_RDX_01;
  pcStack_160 = (code *)&pcStack_128;
  *(undefined8 *)((long)&uStack_198 + lVar3) = 0x163d6e;
  memset(__s_01,0,uVar16);
  uVar17 = (ulong)(uVar15 - 1 >> 3);
  puVar9 = __s_01;
  do {
    uVar4 = p_r2_n[uVar17 & 0xffffffff];
    *puVar9 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    puVar9 = puVar9 + 1;
    bVar18 = uVar17 != 0;
    uVar17 = uVar17 - 1;
  } while (bVar18);
  *(undefined8 *)((long)&uStack_198 + lVar3) = 0x163da1;
  memcpy(pvStack_190,(void *)((long)__s_01 + (uVar16 - uVar15)),(ulong)uVar15);
  return;
}

Assistant:

static inline void
ffdhe_compute_exp(
  Spec_FFDHE_ffdhe_alg a,
  uint64_t *p_r2_n,
  uint64_t *sk_n,
  uint64_t *b_n,
  uint8_t *res
)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
  uint64_t res_n[nLen];
  memset(res_n, 0U, nLen * sizeof (uint64_t));
  uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(p_n[0U]);
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    p_n,
    mu,
    r2_n,
    b_n,
    64U * nLen,
    sk_n,
    res_n);
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(ffdhe_len(a), res_n, res);
}